

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O2

Trampoline * __thiscall
ReferenceMeaning::Eval(Trampoline *__return_storage_ptr__,ReferenceMeaning *this,Sexp *act)

{
  Sexp *pSVar1;
  ContractFrameProtector local_30;
  ContractFrameProtector __contract_frame;
  
  ContractFrameProtector::ContractFrameProtector(&local_30,"Eval");
  ContractFrame::AddContract(local_30.protected_frame,NoGc);
  ContractFrame::CheckPrecondition
            (local_30.protected_frame,act->kind == ACTIVATION,"act->IsActivation()");
  pSVar1 = Activation::Get((act->field_1).activation,this->up_index,this->right_index);
  __return_storage_ptr__->kind = Value;
  (__return_storage_ptr__->field_1).value = pSVar1;
  ContractFrameProtector::~ContractFrameProtector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Trampoline ReferenceMeaning::Eval(Sexp *act) {
  CONTRACT {
    FORBID_GC;
    PRECONDITION(act->IsActivation());
  }